

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_0::AsyncStreamFd::write(AsyncStreamFd *this,int __fd,void *__buf,size_t __n)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  Fault node;
  int iVar3;
  ssize_t sVar4;
  void *pvVar5;
  undefined4 in_register_00000034;
  PromiseArena *pPVar6;
  Exception *this_00;
  Fault f;
  OwnPromiseNode local_60;
  AsyncStreamFd *local_58;
  Fault local_50;
  undefined1 local_48 [24];
  
  pPVar6 = (PromiseArena *)CONCAT44(in_register_00000034,__fd);
  do {
    sVar4 = ::write(*(int *)(pPVar6->bytes + 0x10),__buf,__n);
    if (-1 < sVar4) {
      if (__n - sVar4 != 0) {
        (**(code **)(*(long *)pPVar6->bytes + 0xa0))(this,pPVar6,(long)__buf + sVar4,__n - sVar4);
        return (ssize_t)this;
      }
      goto LAB_00432a99;
    }
    iVar3 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar3 == -1);
  if (iVar3 == 0) {
    local_58 = this;
    UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)&local_60);
    OVar2.ptr = local_60.ptr;
    pPVar1 = (PromiseArena *)
             ((SleepHooks *)&((local_60.ptr)->super_PromiseArenaMember).arena)->_vptr_SleepHooks;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_60.ptr - (long)pPVar1) < 0x38) {
      pvVar5 = operator_new(0x400);
      this_00 = (Exception *)((long)pvVar5 + 0x3c8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)this_00,&local_60,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:202:50)>
                 ::anon_class_24_2_4f696100_for_func::operator());
      *(undefined ***)((long)pvVar5 + 0x3c8) = &PTR_destroy_006251c8;
      *(void **)((long)pvVar5 + 1000) = __buf;
      *(size_t *)((long)pvVar5 + 0x3f0) = __n;
      *(PromiseArena **)((long)pvVar5 + 0x3f8) = pPVar6;
      *(void **)((long)pvVar5 + 0x3d0) = pvVar5;
    }
    else {
      ((SleepHooks *)&((local_60.ptr)->super_PromiseArenaMember).arena)->_vptr_SleepHooks =
           (_func_int **)0x0;
      this_00 = (Exception *)&local_60.ptr[-4].super_PromiseArenaMember.arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)this_00,&local_60,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:202:50)>
                 ::anon_class_24_2_4f696100_for_func::operator());
      OVar2.ptr[-4].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_006251c8;
      OVar2.ptr[-2].super_PromiseArenaMember.arena = (PromiseArena *)__buf;
      OVar2.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)__n;
      OVar2.ptr[-1].super_PromiseArenaMember.arena = pPVar6;
      OVar2.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
    }
    this = local_58;
    local_48._0_8_ = &DAT_0048a171;
    local_48._8_8_ = &DAT_0048a1d0;
    local_48._16_8_ = &DAT_4c0000058b;
    local_50.exception = this_00;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)local_58,(OwnPromiseNode *)&local_50,(SourceLocation *)local_48);
    node.exception = local_50.exception;
    if (local_50.exception != (Exception *)0x0) {
      local_50.exception = (Exception *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.exception);
    }
    OVar2.ptr = local_60.ptr;
    if ((UnixEventPort *)local_60.ptr != (UnixEventPort *)0x0) {
      local_60.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
    }
  }
  else {
    local_50.exception = (Exception *)0x0;
    local_48._0_8_ = (PromiseFulfiller<void> *)0x0;
    local_48._8_8_ = (Disposer *)0x0;
    kj::_::Debug::Fault::init
              (&local_50,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
              );
    kj::_::Debug::Fault::~Fault(&local_50);
LAB_00432a99:
    kj::_::readyNow();
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
    ssize_t n;
    KJ_NONBLOCKING_SYSCALL(n = ::write(fd, buffer.begin(), buffer.size())) {
      // Error.

      // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
      // a bug that exists in both Clang and GCC:
      //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
      //   http://llvm.org/bugs/show_bug.cgi?id=12286
      goto error;
    }
    if (false) {
    error:
      return kj::READY_NOW;
    }

    if (n < 0) {
      // EAGAIN -- need to wait for writability and try again.
      return observer.whenBecomesWritable().then([buffer, this]() {
        return write(buffer);
      });
    } else if (n == buffer.size()) {
      // All done.
      return READY_NOW;
    } else {
      // Fewer than `size` bytes were written, but we CANNOT assume we're out of buffer space, as
      // Linux is known to return partial reads/writes when interrupted by a signal -- yes, even
      // for non-blocking operations. So, we'll need to write() again now, even though it will
      // almost certainly fail with EAGAIN. See comments in the read path for more info.
      buffer = buffer.slice(n);
      return write(buffer);
    }
  }